

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::basic_leakChecker::ZEbasic_leakChecker::zeModuleCreateEpilogue
          (ZEbasic_leakChecker *this,ze_context_handle_t param_1,ze_device_handle_t param_2,
          ze_module_desc_t *param_3,ze_module_handle_t *param_4,
          ze_module_build_log_handle_t *param_5,ze_result_t result)

{
  allocator local_39;
  string local_38;
  
  if (result == ZE_RESULT_SUCCESS) {
    std::__cxx11::string::string((string *)&local_38,"zeModuleCreate",&local_39);
    countFunctionCall(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return result;
}

Assistant:

ze_result_t basic_leakChecker::ZEbasic_leakChecker::zeModuleCreateEpilogue(ze_context_handle_t, ze_device_handle_t, const ze_module_desc_t*, ze_module_handle_t*, ze_module_build_log_handle_t*, ze_result_t result) {
        if (result == ZE_RESULT_SUCCESS) {
            countFunctionCall("zeModuleCreate");
        }
        return result;
    }